

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

CURLcode curl_easy_pause(Curl_easy *data,int action)

{
  uint uVar1;
  connectdata *conn;
  undefined8 uVar2;
  CURLcode CVar3;
  long lVar4;
  undefined8 *puVar5;
  char *ptr;
  ulong uVar6;
  tempbuf writebuf [3];
  Curl_easy *local_80;
  undefined8 local_78 [9];
  
  uVar1 = (action & 1U) * 0x10 + (action & 4U) * 8;
  (data->req).keepon = (data->req).keepon & 0xffffffcfU | uVar1;
  if (((action & 1U) == 0) && (uVar6 = (ulong)(data->state).tempcount, uVar6 != 0)) {
    conn = data->conn;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)local_78 + lVar4 + 0x10) =
           *(undefined8 *)((long)&(data->state).tempwrite[0].type + lVar4);
      puVar5 = (undefined8 *)((long)&(data->state).tempwrite[0].buf + lVar4);
      uVar2 = puVar5[1];
      *(undefined8 *)((long)local_78 + lVar4) = *puVar5;
      *(undefined8 *)((long)local_78 + lVar4 + 8) = uVar2;
      *(undefined8 *)((long)&(data->state).tempwrite[0].buf + lVar4) = 0;
      lVar4 = lVar4 + 0x18;
    } while (uVar6 * 0x18 != lVar4);
    (data->state).tempcount = 0;
    local_80 = conn->data;
    CVar3 = CURLE_OK;
    if (local_80 == data) {
      local_80 = (Curl_easy *)0x0;
    }
    else {
      conn->data = data;
    }
    puVar5 = local_78;
    do {
      if (CVar3 == CURLE_OK) {
        ptr = (char *)*puVar5;
        CVar3 = Curl_client_write(conn,*(int *)(puVar5 + 2),ptr,puVar5[1]);
      }
      else {
        ptr = (char *)*puVar5;
      }
      (*Curl_cfree)(ptr);
      puVar5 = puVar5 + 3;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    if (local_80 != (Curl_easy *)0x0) {
      conn->data = local_80;
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
  if (uVar1 != 0x30) {
    Curl_expire(data,0,EXPIRE_RUN_NOW);
  }
  Curl_updatesocket(data);
  return CURLE_OK;
}

Assistant:

CURLcode curl_easy_pause(struct Curl_easy *data, int action)
{
  struct SingleRequest *k = &data->req;
  CURLcode result = CURLE_OK;

  /* first switch off both pause bits */
  int newstate = k->keepon &~ (KEEP_RECV_PAUSE| KEEP_SEND_PAUSE);

  /* set the new desired pause bits */
  newstate |= ((action & CURLPAUSE_RECV)?KEEP_RECV_PAUSE:0) |
    ((action & CURLPAUSE_SEND)?KEEP_SEND_PAUSE:0);

  /* put it back in the keepon */
  k->keepon = newstate;

  if(!(newstate & KEEP_RECV_PAUSE) && data->state.tempcount) {
    /* there are buffers for sending that can be delivered as the receive
       pausing is lifted! */
    unsigned int i;
    unsigned int count = data->state.tempcount;
    struct tempbuf writebuf[3]; /* there can only be three */
    struct connectdata *conn = data->conn;
    struct Curl_easy *saved_data = NULL;

    /* copy the structs to allow for immediate re-pausing */
    for(i = 0; i < data->state.tempcount; i++) {
      writebuf[i] = data->state.tempwrite[i];
      data->state.tempwrite[i].buf = NULL;
    }
    data->state.tempcount = 0;

    /* set the connection's current owner */
    if(conn->data != data) {
      saved_data = conn->data;
      conn->data = data;
    }

    for(i = 0; i < count; i++) {
      /* even if one function returns error, this loops through and frees all
         buffers */
      if(!result)
        result = Curl_client_write(conn, writebuf[i].type, writebuf[i].buf,
                                   writebuf[i].len);
      free(writebuf[i].buf);
    }

    /* recover previous owner of the connection */
    if(saved_data)
      conn->data = saved_data;

    if(result)
      return result;
  }

  /* if there's no error and we're not pausing both directions, we want
     to have this handle checked soon */
  if(!result &&
     ((newstate&(KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) !=
      (KEEP_RECV_PAUSE|KEEP_SEND_PAUSE)) )
    Curl_expire(data, 0, EXPIRE_RUN_NOW); /* get this handle going again */

  /* This transfer may have been moved in or out of the bundle, update
     the corresponding socket callback, if used */
  Curl_updatesocket(data);

  return result;
}